

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<vector<int>_> * __thiscall
vector<vector<int>_>::operator=(vector<vector<int>_> *this,vector<vector<int>_> *other)

{
  long *plVar1;
  undefined4 *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  this->_size = other->_size;
  lVar4 = (long)other->_capacity;
  this->_capacity = other->_capacity;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 0x10 + 8;
  }
  plVar1 = (long *)operator_new__(uVar3);
  *plVar1 = lVar4;
  if (lVar4 != 0) {
    lVar5 = 0;
    do {
      puVar2 = (undefined4 *)operator_new__(4);
      *puVar2 = 0;
      *(undefined4 **)((long)plVar1 + lVar5 + 8) = puVar2;
      *(undefined8 *)((long)plVar1 + lVar5 + 0x10) = 0x100000000;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 * 0x10 != lVar5);
  }
  this->vect = (vector<int> *)(plVar1 + 1);
  if (0 < this->_size) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      vector<int>::operator=
                ((vector<int> *)((long)&this->vect->vect + lVar5),
                 (vector<int> *)((long)&other->vect->vect + lVar5));
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < this->_size);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }